

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  ulong uVar2;
  pointer pLVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  uint *puVar6;
  ImageInfiniteLight *this_00;
  LightHandle *light;
  pointer pLVar7;
  DiffuseAreaLight *this_01;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar21 [16];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  SampledSpectrum SVar30;
  Vector3f local_78;
  undefined1 local_68 [16];
  Ray local_58;
  undefined1 auVar14 [64];
  undefined1 auVar22 [64];
  undefined1 auVar26 [56];
  
  if ((this->type == Light) ||
     ((auVar8 = ZEXT816(0) << 0x40, this->type == Surface &&
      (((this->field_2).si.areaLight.
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits & 0xffffffffffff) != 0)))) {
    local_78.super_Tuple3<pbrt::Vector3,_float>.z =
         ((v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
         (v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
         ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
         (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    uVar1 = *(undefined8 *)
             &(v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])&v->field_2,
                           ZEXT416((uint)(v->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                           0x10);
    auVar10._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
    auVar10._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
    auVar10._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
    auVar10._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
    uVar1 = *(undefined8 *)
             &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                           ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                           0x10);
    auVar27._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
    auVar27._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
    auVar27._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
    auVar27._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
    auVar8 = vsubps_avx(auVar10,auVar27);
    uVar2 = vmovlps_avx(auVar8);
    local_78.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
    local_78.super_Tuple3<pbrt::Vector3,_float>.y = (float)(uVar2 >> 0x20);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_78.super_Tuple3<pbrt::Vector3,_float>.y *
                                           local_78.super_Tuple3<pbrt::Vector3,_float>.y)),
                             ZEXT416((uint)local_78.super_Tuple3<pbrt::Vector3,_float>.x),
                             ZEXT416((uint)local_78.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar10 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_78.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_78.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar8 = ZEXT816(0) << 0x40;
    fVar9 = auVar10._0_4_;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      if (fVar9 < 0.0) {
        local_78.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar2;
        fVar9 = sqrtf(fVar9);
        auVar8 = ZEXT816(0) << 0x40;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar9 = auVar10._0_4_;
        local_78.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar2;
      }
      auVar19._8_8_ = 0;
      auVar19._0_4_ = local_78.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar19._4_4_ = local_78.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar28._4_4_ = fVar9;
      auVar28._0_4_ = fVar9;
      auVar28._8_4_ = fVar9;
      auVar28._12_4_ = fVar9;
      auVar10 = vdivps_avx(auVar19,auVar28);
      local_78.super_Tuple3<pbrt::Vector3,_float>.z =
           local_78.super_Tuple3<pbrt::Vector3,_float>.z / fVar9;
      local_78.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar10);
      if ((this->type == Light) &&
         ((puVar6 = (uint *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff),
          puVar6 == (uint *)0x0 || ((*puVar6 & 0xfffffffd) == 1)))) {
        pLVar7 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar3 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pLVar7 != pLVar3) {
          local_68 = auVar8;
          do {
            uVar1 = *(undefined8 *)
                     &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            auVar8 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                   ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                                 super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high),0x10);
            auVar11._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
            auVar11._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
            auVar11._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
            auVar11._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
            local_58.o.super_Tuple3<pbrt::Point3,_float>.z =
                 ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                 (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
            auVar29._0_8_ = local_78.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            auVar29._8_4_ = 0x80000000;
            auVar29._12_4_ = 0x80000000;
            local_58.d.super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_78.super_Tuple3<pbrt::Vector3,_float>.z;
            local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11);
            local_58.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar29);
            local_58.time = 0.0;
            local_58.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            uVar2 = (pLVar7->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            auVar8 = ZEXT416(0) << 0x20;
            auVar18 = ZEXT456(0);
            auVar20._0_12_ = ZEXT812(0);
            auVar20._12_4_ = 0;
            auVar26 = ZEXT456(0);
            uVar5 = (ushort)(uVar2 >> 0x30);
            if (6 < uVar5) {
              this_00 = (ImageInfiniteLight *)(uVar2 & 0xffffffffffff);
              if (uVar2 >> 0x30 == 8) {
                SVar30 = ImageInfiniteLight::Le(this_00,&local_58,lambda);
                auVar23._0_8_ = SVar30.values.values._8_8_;
                auVar23._8_56_ = auVar26;
                auVar20 = auVar23._0_16_;
                auVar15._0_8_ = SVar30.values.values._0_8_;
                auVar15._8_56_ = auVar18;
                auVar8 = auVar15._0_16_;
              }
              else if (uVar5 == 7) {
                SVar30 = UniformInfiniteLight::Le((UniformInfiniteLight *)this_00,&local_58,lambda);
                auVar22._0_8_ = SVar30.values.values._8_8_;
                auVar22._8_56_ = auVar26;
                auVar20 = auVar22._0_16_;
                auVar14._0_8_ = SVar30.values.values._0_8_;
                auVar14._8_56_ = auVar18;
                auVar8 = auVar14._0_16_;
              }
              else {
                SVar30 = PortalImageInfiniteLight::Le
                                   ((PortalImageInfiniteLight *)this_00,&local_58,lambda);
                auVar24._0_8_ = SVar30.values.values._8_8_;
                auVar24._8_56_ = auVar26;
                auVar20 = auVar24._0_16_;
                auVar16._0_8_ = SVar30.values.values._0_8_;
                auVar16._8_56_ = auVar18;
                auVar8 = auVar16._0_16_;
              }
            }
            auVar10 = vmovlhps_avx(auVar8,auVar20);
            auVar8._0_4_ = auVar10._0_4_ + local_68._0_4_;
            auVar8._4_4_ = auVar10._4_4_ + local_68._4_4_;
            auVar8._8_4_ = auVar10._8_4_ + local_68._8_4_;
            auVar8._12_4_ = auVar10._12_4_ + local_68._12_4_;
            pLVar7 = pLVar7 + 1;
            local_68 = auVar8;
          } while (pLVar7 != pLVar3);
        }
      }
      else {
        uVar2 = (this->field_2).si.areaLight.
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                .bits;
        this_01 = (DiffuseAreaLight *)(uVar2 & 0xffffffffffff);
        if (this_01 != (DiffuseAreaLight *)0x0) {
          uVar1 = *(undefined8 *)
                   &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          auVar8 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                 ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                               super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
          auVar12._0_4_ = (float)uVar1 + auVar8._0_4_;
          auVar12._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar8._4_4_;
          auVar12._8_4_ = auVar8._8_4_ + 0.0;
          auVar12._12_4_ = auVar8._12_4_ + 0.0;
          auVar4._8_4_ = 0x3f000000;
          auVar4._0_8_ = 0x3f0000003f000000;
          auVar4._12_4_ = 0x3f000000;
          auVar8 = vmulps_avx512vl(auVar12,auVar4);
          local_58.o.super_Tuple3<pbrt::Point3,_float>.z =
               ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
          local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar8);
          if ((this_01->super_LightBase).type != Area) {
            LogFatal<char_const(&)[26]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                       ,0x34f,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
          }
          auVar13._12_4_ = 0;
          auVar13._0_12_ = ZEXT812(0);
          auVar13 = auVar13 << 0x20;
          auVar18 = ZEXT856(0);
          auVar21._0_12_ = ZEXT812(0);
          auVar21._12_4_ = 0;
          auVar26 = ZEXT456(0);
          if ((short)(uVar2 >> 0x30) == 6) {
            SVar30 = DiffuseAreaLight::L(this_01,&local_58.o,&(this->field_2).ei.super_Interaction.n
                                         ,&(this->field_2).ei.super_Interaction.uv,&local_78,lambda)
            ;
            auVar25._0_8_ = SVar30.values.values._8_8_;
            auVar25._8_56_ = auVar26;
            auVar21 = auVar25._0_16_;
            auVar17._0_8_ = SVar30.values.values._0_8_;
            auVar17._8_56_ = auVar18;
            auVar13 = auVar17._0_16_;
          }
          auVar8 = vmovlhps_avx(auVar13,auVar21);
        }
      }
    }
  }
  auVar10 = vshufpd_avx(auVar8,auVar8,1);
  SVar30.values.values._0_8_ = auVar8._0_8_;
  SVar30.values.values._8_8_ = auVar10._0_8_;
  return (SampledSpectrum)SVar30.values.values;
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else {
            return si.areaLight ? si.areaLight.L(si.p(), si.n, si.uv, w, lambda)
                                : SampledSpectrum(0.);
        }
    }